

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap.c
# Opt level: O0

uint32 remap(map_t *m,uint32 x)

{
  uint hx_00;
  uint32 hx;
  uint32 x_local;
  map_t *m_local;
  
  hx_00 = x % m->n_map;
  if (m->map[hx_00].x == x) {
    m_local._4_4_ = m->map[hx_00].y;
  }
  else {
    m_local._4_4_ = remap_assign(m,hx_00,x);
  }
  return m_local._4_4_;
}

Assistant:

uint32
remap(map_t *m, uint32 x)
{
    uint32 hx;

    hx = x % m->n_map;
    
    if (m->map[hx].x == x)
	return m->map[hx].y;
    else {
	return remap_assign(m, hx, x);
    }
}